

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

UBool uset_getSerializedSet_63(USerializedSet *fillSet,uint16_t *src,int32_t srcLength)

{
  uint local_28;
  int32_t length;
  int32_t srcLength_local;
  uint16_t *src_local;
  USerializedSet *fillSet_local;
  
  if (fillSet == (USerializedSet *)0x0) {
    fillSet_local._7_1_ = '\0';
  }
  else if ((src == (uint16_t *)0x0) || (srcLength < 1)) {
    fillSet->bmpLength = 0;
    fillSet->length = 0;
    fillSet_local._7_1_ = '\0';
  }
  else {
    _length = src + 1;
    local_28 = (uint)*src;
    if ((*src & 0x8000) == 0) {
      if (srcLength < (int)(local_28 + 1)) {
        fillSet->bmpLength = 0;
        fillSet->length = 0;
        return '\0';
      }
      fillSet->bmpLength = local_28;
    }
    else {
      local_28 = local_28 & 0x7fff;
      if (srcLength < (int)(local_28 + 2)) {
        fillSet->bmpLength = 0;
        fillSet->length = 0;
        return '\0';
      }
      fillSet->bmpLength = (uint)*_length;
      _length = src + 2;
    }
    fillSet->array = _length;
    fillSet->length = local_28;
    fillSet_local._7_1_ = '\x01';
  }
  return fillSet_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_getSerializedSet(USerializedSet* fillSet, const uint16_t* src, int32_t srcLength) {
    int32_t length;

    if(fillSet==NULL) {
        return FALSE;
    }
    if(src==NULL || srcLength<=0) {
        fillSet->length=fillSet->bmpLength=0;
        return FALSE;
    }

    length=*src++;
    if(length&0x8000) {
        /* there are supplementary values */
        length&=0x7fff;
        if(srcLength<(2+length)) {
            fillSet->length=fillSet->bmpLength=0;
            return FALSE;
        }
        fillSet->bmpLength=*src++;
    } else {
        /* only BMP values */
        if(srcLength<(1+length)) {
            fillSet->length=fillSet->bmpLength=0;
            return FALSE;
        }
        fillSet->bmpLength=length;
    }
    fillSet->array=src;
    fillSet->length=length;
    return TRUE;
}